

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall Json::Value::getComment_abi_cxx11_(Value *this,CommentPlacement placement)

{
  char *pcVar1;
  bool bVar2;
  CommentPlacement in_EDX;
  Value *in_RSI;
  string *in_RDI;
  allocator local_25 [16];
  allocator local_15;
  CommentPlacement local_14;
  
  local_14 = in_EDX;
  bVar2 = hasComment(in_RSI,in_EDX);
  if (bVar2) {
    pcVar1 = in_RSI->comments_[local_14].comment_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return in_RDI;
}

Assistant:

std::string Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}